

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

ALLEGRO_USTR * ustr_split_next(ALLEGRO_USTR *ustr,ALLEGRO_USTR_INFO *info,int *pos,char *delimiter)

{
  int iVar1;
  ALLEGRO_USTR *pAVar2;
  int local_2c;
  
  local_2c = al_ustr_size();
  if (*pos < local_2c) {
    iVar1 = al_ustr_find_set_cstr(ustr,*pos,"\n");
    if (iVar1 != -1) {
      local_2c = iVar1;
    }
    pAVar2 = (ALLEGRO_USTR *)al_ref_ustr(info,ustr,*pos,local_2c);
    al_ustr_next(ustr,&local_2c);
    *pos = local_2c;
  }
  else {
    pAVar2 = (ALLEGRO_USTR *)0x0;
  }
  return pAVar2;
}

Assistant:

static const ALLEGRO_USTR *ustr_split_next(const ALLEGRO_USTR *ustr,
   ALLEGRO_USTR_INFO *info, int *pos, const char *delimiter)
{
   const ALLEGRO_USTR *result;
   int end, size;

   size = al_ustr_size(ustr);
   if (*pos >= size) {
      return NULL;
   }

   end = al_ustr_find_set_cstr(ustr, *pos, delimiter);
   if (end == -1)
      end = size;

   result = al_ref_ustr(info, ustr, *pos, end);
   /* Set pos to character AFTER delimiter */
   al_ustr_next(ustr, &end);
   (*pos) = end;
   return result;
}